

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::FindHelper(pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
             *__return_storage_ptr__,InnerMap *this,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,TreeIterator *it)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k0;
  LogMessage *other;
  const_iterator local_f0;
  _Base_ptr local_d8;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  local_d0;
  _Self local_b8;
  _Self local_b0;
  iterator tree_it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  Tree *tree;
  byte local_81;
  LogMessage local_80;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  local_48;
  Node *local_30;
  Node *node;
  size_type b;
  TreeIterator *it_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  InnerMap *this_local;
  
  b = (size_type)it;
  it_local = (TreeIterator *)k;
  k_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  node = (Node *)BucketNumber(this,k);
  bVar1 = TableEntryIsNonEmptyList(this,(size_type)node);
  if (bVar1) {
    local_30 = (Node *)this->table_[(long)node];
    do {
      k0 = KeyPtrFromNodePtr(local_30);
      bVar1 = IsMatch(this,k0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              it_local);
      if (bVar1) {
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
        ::iterator_base(&local_48,local_30,this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<std::__cxx11::string,long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair_const>,unsigned_long&>
                  (__return_storage_ptr__,&local_48,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
      local_30 = local_30->next;
    } while (local_30 != (Node *)0x0);
    local_30 = (Node *)0x0;
  }
  else {
    bVar1 = TableEntryIsTree(this,(size_type)node);
    if (bVar1) {
      local_81 = 0;
      if (this->table_[(long)node] != this->table_[(ulong)node ^ 1]) {
        internal::LogMessage::LogMessage
                  (&local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x27c);
        local_81 = 1;
        other = internal::LogMessage::operator<<
                          (&local_80,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),other);
      }
      if ((local_81 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_80);
      }
      node = (Node *)((ulong)node & 0xfffffffffffffffe);
      this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *)this->table_[(long)node];
      tree_it._M_node = (_Base_ptr)it_local;
      local_b0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           ::find(this_00,(key_type *)&tree_it);
      local_b8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           ::end(this_00);
      bVar1 = std::operator!=(&local_b0,&local_b8);
      if (bVar1) {
        if (b != 0) {
          *(_Base_ptr *)b = local_b0._M_node;
        }
        local_d8 = local_b0._M_node;
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
        ::iterator_base(&local_d0,(TreeIterator)local_b0._M_node,this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<std::__cxx11::string,long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair_const>,unsigned_long&>
                  (__return_storage_ptr__,&local_d0,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
    }
  }
  end(&local_f0,this);
  std::
  make_pair<google::protobuf::Map<std::__cxx11::string,long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair_const>,unsigned_long&>
            (__return_storage_ptr__,&local_f0,(unsigned_long *)&node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const Key& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (IsMatch(*KeyPtrFromNodePtr(node), k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != NULL);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        Key* key = const_cast<Key*>(&k);
        typename Tree::iterator tree_it = tree->find(key);
        if (tree_it != tree->end()) {
          if (it != NULL) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }